

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O1

vector<int,_std::allocator<int>_> *
cppqc::shrinkIntegral<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int x)

{
  iterator iVar1;
  int iVar2;
  ulong uVar3;
  int local_2c;
  int local_28 [2];
  
  uVar3 = (ulong)(uint)x;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (x < 0) {
    local_28[0] = -x;
    iVar1._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (__return_storage_ptr__,iVar1,local_28);
    }
    else {
      *iVar1._M_current = local_28[0];
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if (x != 0) {
    do {
      iVar2 = (int)uVar3;
      local_2c = x - iVar2;
      iVar1._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar1,&local_2c);
      }
      else {
        *iVar1._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar3 = (ulong)(uint)((int)(uVar3 >> 0x1f) + iVar2 >> 1);
    } while (2 < iVar2 + 1U);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integral> shrinkIntegral(Integral x) {
  std::vector<Integral> ret;
  if (std::numeric_limits<Integral>::is_signed && x < 0) {
    if (x == std::numeric_limits<Integral>::min()) {
      ret.push_back(std::numeric_limits<Integral>::max());
    } else {
      assert(-x > 0);
      ret.push_back(-x);
    }
  }

  for (Integral n = x; n != 0; n /= 2)
    ret.push_back(x - n);
  return ret;
}